

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O0

void __thiscall
ps::Publisher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::
Publisher(Publisher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
          *this,topic_ptr_t<std::__cxx11::basic_string<char>_*> *topic)

{
  size_t sVar1;
  element_type *this_00;
  topic_ptr_t<std::__cxx11::basic_string<char>_*> *topic_local;
  Publisher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *this_local;
  
  this->_vptr_Publisher = (_func_int **)&PTR___cxa_pure_virtual_00125d00;
  sVar1 = get_counter();
  this->id = sVar1;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>_>
  ::map(&this->m_reverse);
  std::
  vector<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
  ::vector(&this->m_topics);
  std::map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  ::map(&this->m_signals);
  std::mutex::mutex(&this->m);
  std::
  vector<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
  ::push_back(&this->m_topics,topic);
  this_00 = std::
            __shared_ptr_access<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)topic);
  Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::attach
            (this_00,this);
  return;
}

Assistant:

Publisher(const topic_ptr_t<T>& topic)
		: id{get_counter()}
		{
			m_topics.push_back(topic);
			topic->attach(this);
		}